

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_function_queue.h
# Opt level: O1

bool __thiscall
density::
conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
::try_reentrant_consume_impl_cached
          (conc_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
           *this,reentrant_consume_operation *param_2)

{
  bool bVar1;
  FunctionRuntimeType<(density::function_type_erasure)0,_void_()> *pFVar2;
  void *pvVar3;
  
  bVar1 = conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
          ::reentrant_consume_operation::start_consume_impl(param_2,0,&this->m_queue);
  if (bVar1) {
    pFVar2 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_consume_operation::complete_type(&param_2->m_consume_operation);
    pvVar3 = heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_consume_operation::unaligned_element_ptr(&param_2->m_consume_operation);
    (*pFVar2->m_align_invoke_destroy)(pvVar3);
    conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_consume_operation::commit_nodestroy(param_2);
  }
  return bVar1;
}

Assistant:

bool try_reentrant_consume_impl_cached(
          std::true_type, reentrant_consume_operation & i_consume, PARAMS... i_params)
        {
            if (m_queue.try_start_reentrant_consume(i_consume))
            {
                i_consume.complete_type().align_invoke_destroy(
                  i_consume.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                i_consume.commit_nodestroy();
                return true;
            }
            else
            {
                return false;
            }
        }